

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avi_io.cpp
# Opt level: O2

void print_wave(WAVEFORMAT *wave)

{
  puts("\nWave Info");
  printf("nAvgBytesPerSec:\t%d\n",(ulong)wave->nAvgBytesPerSec);
  printf("nBlockAlign:\t%d\n",(ulong)wave->nBlockAlign);
  printf("nChannels:\t%d\n",(ulong)wave->nChannels);
  printf("nSamplesPerSec:\t%d\n",(ulong)wave->nSamplesPerSec);
  printf("wBitsPerSample:\t%d\n",(ulong)wave->wBitsPerSample);
  printf("wFormatTag:\t%d\n",(ulong)wave->wFormatTag);
  return;
}

Assistant:

void print_wave(WAVEFORMAT &wave) {
    printf("\nWave Info\n");
    printf("nAvgBytesPerSec:\t%d\n", wave.nAvgBytesPerSec);
    printf("nBlockAlign:\t%d\n", wave.nBlockAlign);
    printf("nChannels:\t%d\n", wave.nChannels);
    printf("nSamplesPerSec:\t%d\n", wave.nSamplesPerSec);
    printf("wBitsPerSample:\t%d\n", wave.wBitsPerSample);
    printf("wFormatTag:\t%d\n", wave.wFormatTag);
}